

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

void __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
          (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this,PolyNf *t)

{
  anon_class_16_2_f84bbffd f;
  __mpz_struct _Stack_38;
  PolyNf local_28;
  
  IntegerConstantType::IntegerConstantType((IntegerConstantType *)&_Stack_38,1);
  local_28.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[7] = '\0';
  local_28.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[8] = '\0';
  local_28.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[9] = '\0';
  local_28.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[10] = '\0';
  local_28.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0xb] = '\0';
  local_28.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0xc] = '\0';
  local_28.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0xd] = '\0';
  local_28.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0xe] = '\0';
  local_28.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0xf] = '\0';
  local_28.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0x10] = '\0';
  local_28.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0x11] = '\0';
  local_28.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0x12] = '\0';
  local_28.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._content[0x13] = '\0';
  local_28.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._21_3_ = 0;
  local_28.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._0_8_ = (ulong)*(byte *)&(t->super_PolyNfSuper)._inner.
                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                            .
                            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           & 0xffffffffffffff03;
  f.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
             *)t;
  f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
            *)&local_28;
  ::Lib::CoproductImpl::
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  ::
  switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
            ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
              *)&local_28,f);
  Polynom(this,(Numeral *)&_Stack_38,&local_28);
  mpz_clear(&_Stack_38);
  return;
}

Assistant:

Polynom<Number>::Polynom(PolyNf t) 
  : Polynom(Numeral(1), t) 
{ integrity();  }